

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::IfcStructuralLinearAction
          (IfcStructuralLinearAction *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralLinearAction *this_local;
  
  IfcStructuralAction::IfcStructuralAction(&this->super_IfcStructuralAction,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearAction,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearAction,_1UL> *)
             &(this->super_IfcStructuralAction).field_0x178,vtt + 0x28);
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
              super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                                super_IfcProduct.super_IfcObject + -0x18)) = vtt[0x2a];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x88 = vtt[0x2b];
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x2c];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0xd0 = vtt[0x2d];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             field_0x100 = vtt[0x2e];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 = vtt[0x2f];
  *(void **)&(this->super_IfcStructuralAction).field_0x178 = vtt[0x30];
  std::__cxx11::string::string((string *)&(this->super_IfcStructuralAction).field_0x188);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}